

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateInitDefaultSplitInstance
          (MessageGenerator *this,Printer *p)

{
  Options *opts;
  Descriptor *this_00;
  pointer ppFVar1;
  FieldDescriptor *field;
  bool bVar2;
  FieldGenerator *this_01;
  Options *in_RCX;
  pointer ppFVar3;
  Span<const_google::protobuf::io::Printer::Sub> vars;
  Span<const_google::protobuf::io::Printer::Sub> vars_00;
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
  t;
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
  v;
  pointer local_150;
  pointer local_148;
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
  local_138;
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
  local_120;
  Options local_108;
  
  opts = &this->options_;
  bVar2 = ShouldSplit(this->descriptor_,opts);
  if (bVar2) {
    this_00 = this->descriptor_;
    Options::Options(&local_108,opts);
    cpp::anon_unknown_0::ClassVars
              ((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                *)&local_150,(anon_unknown_0 *)this_00,(Descriptor *)&local_108,in_RCX);
    vars.len_ = ((long)local_148 - (long)local_150 >> 3) * -0x2c8590b21642c859;
    vars.ptr_ = local_150;
    io::Printer::WithDefs(&local_120,p,vars,false);
    std::
    vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
    ::~vector((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
               *)&local_150);
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~raw_hash_set(&local_108.field_listener_options.forbidden_field_listener_events.
                     super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   );
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108.annotation_guard_name._M_dataplus._M_p !=
        &local_108.annotation_guard_name.field_2) {
      operator_delete(local_108.annotation_guard_name._M_dataplus._M_p,
                      local_108.annotation_guard_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108.annotation_pragma_name._M_dataplus._M_p !=
        &local_108.annotation_pragma_name.field_2) {
      operator_delete(local_108.annotation_pragma_name._M_dataplus._M_p,
                      local_108.annotation_pragma_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108.runtime_include_base._M_dataplus._M_p !=
        &local_108.runtime_include_base.field_2) {
      operator_delete(local_108.runtime_include_base._M_dataplus._M_p,
                      local_108.runtime_include_base.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108.dllexport_decl._M_dataplus._M_p != &local_108.dllexport_decl.field_2) {
      operator_delete(local_108.dllexport_decl._M_dataplus._M_p,
                      local_108.dllexport_decl.field_2._M_allocated_capacity + 1);
    }
    MakeTrackerCalls(&local_138,this->descriptor_,opts);
    vars_00.len_ = ((long)local_138.
                          super__Vector_base<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_138.
                          super__Vector_base<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x2c8590b21642c859;
    vars_00.ptr_ = local_138.
                   super__Vector_base<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    io::Printer::WithDefs
              ((Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
                *)&local_150,p,vars_00,false);
    std::
    vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
    ::~vector(&local_138);
    io::Printer::Emit(p,0,0,1,"\n");
    ppFVar3 = (this->optimized_order_).
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppFVar1 = (this->optimized_order_).
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (ppFVar3 != ppFVar1) {
      do {
        field = *ppFVar3;
        bVar2 = ShouldSplit(field,opts);
        if (bVar2) {
          this_01 = FieldGeneratorTable::get(&this->field_generators_,field);
          FieldGenerator::GenerateConstexprAggregateInitializer(this_01,p);
        }
        ppFVar3 = ppFVar3 + 1;
      } while (ppFVar3 != ppFVar1);
    }
    absl::lts_20250127::
    Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:1166:28)>
    ::~Cleanup((Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
                *)&local_150);
    absl::lts_20250127::
    Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:1166:28)>
    ::~Cleanup(&local_120);
  }
  return;
}

Assistant:

void MessageGenerator::GenerateInitDefaultSplitInstance(io::Printer* p) {
  if (!ShouldSplit(descriptor_, options_)) return;

  auto v = p->WithVars(ClassVars(descriptor_, options_));
  auto t = p->WithVars(MakeTrackerCalls(descriptor_, options_));
  p->Emit("\n");
  for (const auto* field : optimized_order_) {
    if (ShouldSplit(field, options_)) {
      field_generators_.get(field).GenerateConstexprAggregateInitializer(p);
    }
  }
}